

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::AddMessage
          (V2TransportTester *this,string *m_type,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long in_FS_OFFSET;
  CSerializedNetMsg msg;
  CSerializedNetMsg local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_68.m_type.field_2;
  local_68.m_type._M_string_length = 0;
  local_68.m_type.field_2._M_local_buf[0] = '\0';
  local_68.m_type._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_68.m_type,m_type);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&local_68.data,payload)
  ;
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&this->m_msg_to_send,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_type._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_type._M_dataplus._M_p,
                    CONCAT71(local_68.m_type.field_2._M_allocated_capacity._1_7_,
                             local_68.m_type.field_2._M_local_buf[0]) + 1);
  }
  if (local_68.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddMessage(std::string m_type, std::vector<uint8_t> payload)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(m_type);
        msg.data = std::move(payload);
        m_msg_to_send.push_back(std::move(msg));
    }